

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O0

void ffdict_init(ion_dictionary_handler_t *handler)

{
  ion_dictionary_handler_t *handler_local;
  
  handler->insert = ffdict_insert;
  handler->create_dictionary = ffdict_create_dictionary;
  handler->get = ffdict_get;
  handler->update = ffdict_update;
  handler->find = ffdict_find;
  handler->remove = ffdict_delete;
  handler->delete_dictionary = ffdict_delete_dictionary;
  handler->destroy_dictionary = ffdict_destroy_dictionary;
  handler->open_dictionary = ffdict_open_dictionary;
  handler->close_dictionary = ffdict_close_dictionary;
  return;
}

Assistant:

void
ffdict_init(
	ion_dictionary_handler_t *handler
) {
	handler->insert				= ffdict_insert;
	handler->create_dictionary	= ffdict_create_dictionary;
	handler->get				= ffdict_get;
	handler->update				= ffdict_update;
	handler->find				= ffdict_find;
	handler->remove				= ffdict_delete;
	handler->delete_dictionary	= ffdict_delete_dictionary;
	handler->destroy_dictionary = ffdict_destroy_dictionary;
	handler->open_dictionary	= ffdict_open_dictionary;
	handler->close_dictionary	= ffdict_close_dictionary;
}